

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_key_usage_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::ExtendedKeyUsageTest_ExtraData_Test::TestBody
          (ExtendedKeyUsageTest_ExtraData_Test *this)

{
  bool bVar1;
  char *message;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *in_RCX;
  char *in_R9;
  Input extension_value;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0 [3];
  Span<const_unsigned_char> local_88;
  Input local_78;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_;
  vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> ekus;
  uint8_t extra_data [25];
  ExtendedKeyUsageTest_ExtraData_Test *this_local;
  
  ekus.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x501062b08061430;
  ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::vector
            ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&gtest_ar_.message_);
  Span<unsigned_char_const>::Span<25ul>
            ((Span<unsigned_char_const> *)&local_88,
             (uchar (*) [25])
             &ekus.super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  bssl::der::Input::Input(&local_78,local_88);
  extension_value.data_.size_ = (size_t)&gtest_ar_.message_;
  extension_value.data_.data_ = (uchar *)local_78.data_.size_;
  bVar1 = ParseEKUExtension((bssl *)local_78.data_.data_,extension_value,in_RCX);
  local_61 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_60,&local_61,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c8,(internal *)local_60,
               (AssertionResult *)"ParseEKUExtension(der::Input(extra_data), &ekus)","true","false",
               in_R9);
    message = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/extended_key_usage_unittest.cc"
               ,0x7a,message);
    testing::internal::AssertHelper::operator=(&local_a8,local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    ::std::__cxx11::string::~string((string *)&local_c8);
    testing::Message::~Message(local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  ::std::vector<bssl::der::Input,_std::allocator<bssl::der::Input>_>::~vector
            ((vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(ExtendedKeyUsageTest, ExtraData) {
  // clang-format off
  const uint8_t extra_data[] = {
      0x30, 0x14,  // SEQUENCE (20 bytes)
      0x06, 0x08,  // OBJECT IDENTIFIER (8 bytes)
      0x2B, 0x06, 0x01, 0x05, 0x05, 0x07, 0x03, 0x01,  // 1.3.6.1.5.5.7.3.1
      0x06, 0x08,  // OBJECT IDENTIFIER (8 bytes)
      0x2B, 0x06, 0x01, 0x05, 0x05, 0x07, 0x03, 0x02,  // 1.3.6.1.5.5.7.3.2
      // end of SEQUENCE
      0x02, 0x01,  // INTEGER (1 byte)
      0x01  // 1
  };
  // clang-format on

  std::vector<der::Input> ekus;
  EXPECT_FALSE(ParseEKUExtension(der::Input(extra_data), &ekus));
}